

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O3

void __thiscall
Lib::UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_>::~UniquePersistentIterator
          (UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_> *this)

{
  Term *pTVar1;
  Term *pTVar2;
  
  pTVar2 = (Term *)this->_items;
  while (pTVar1 = pTVar2, pTVar1 != (Term *)0x0) {
    pTVar1->_vptr_Term = (_func_int **)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    pTVar2 = *(Term **)&pTVar1->_functor;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pTVar1;
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

~UniquePersistentIterator()
  {
    if(_items) {
      ItemList::destroy(_items);
    }
  }